

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::BitstringPropagateStats
          (ClientContext *context,BoundAggregateExpression *expr,AggregateStatisticsInput *input)

{
  bool bVar1;
  BaseStatistics *in_RDI;
  BitstringAggBindData *bind_agg_data;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> stats;
  BaseStatistics *in_stack_ffffffffffffffa8;
  
  stats._M_head_impl = in_RDI;
  vector<duckdb::BaseStatistics,_true>::operator[]
            ((vector<duckdb::BaseStatistics,_true> *)in_RDI,(size_type)in_RDI);
  bVar1 = NumericStats::HasMinMax(stats._M_head_impl);
  if (bVar1) {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)stats._M_head_impl);
    FunctionData::Cast<duckdb::BitstringAggBindData>((FunctionData *)stats._M_head_impl);
    vector<duckdb::BaseStatistics,_true>::operator[]
              ((vector<duckdb::BaseStatistics,_true> *)stats._M_head_impl,(size_type)in_RDI);
    NumericStats::Min(in_stack_ffffffffffffffa8);
    Value::operator=((Value *)stats._M_head_impl,(Value *)in_RDI);
    Value::~Value((Value *)stats._M_head_impl);
    vector<duckdb::BaseStatistics,_true>::operator[]
              ((vector<duckdb::BaseStatistics,_true> *)stats._M_head_impl,(size_type)in_RDI);
    NumericStats::Max(in_stack_ffffffffffffffa8);
    Value::operator=((Value *)stats._M_head_impl,(Value *)in_RDI);
    Value::~Value((Value *)stats._M_head_impl);
  }
  unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
  unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)stats._M_head_impl,in_RDI);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         stats._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> BitstringPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                                   AggregateStatisticsInput &input) {

	if (NumericStats::HasMinMax(input.child_stats[0])) {
		auto &bind_agg_data = input.bind_data->Cast<BitstringAggBindData>();
		bind_agg_data.min = NumericStats::Min(input.child_stats[0]);
		bind_agg_data.max = NumericStats::Max(input.child_stats[0]);
	}
	return nullptr;
}